

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O2

mFILE * mstdin(void)

{
  mFILE *pmVar1;
  mFILE *pmVar2;
  
  pmVar2 = m_channel_0;
  if (m_channel_0 == (mFILE *)0x0) {
    pmVar1 = mfcreate((char *)0x0,0);
    pmVar2 = (mFILE *)0x0;
    m_channel_0 = pmVar1;
    if (pmVar1 != (mFILE *)0x0) {
      pmVar1->fp = _stdin;
      pmVar2 = pmVar1;
    }
  }
  return pmVar2;
}

Assistant:

mFILE *mstdin(void) {
    if (m_channel[0])
	return m_channel[0];

    m_channel[0] = mfcreate(NULL, 0);
    if (NULL == m_channel[0]) return NULL;
    m_channel[0]->fp = stdin;
    return m_channel[0];
}